

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_LayoutData.H
# Opt level: O0

void __thiscall
amrex::LayoutData<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_*>::~LayoutData
          (LayoutData<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_*> *this)

{
  LayoutData<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_*> *in_RDI;
  
  ~LayoutData(in_RDI);
  operator_delete(in_RDI,0x110);
  return;
}

Assistant:

~LayoutData () { if (m_need_to_clear_bd) clearThisBD(); }